

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::StdGrammarStackElement::SetErrorData
          (StdGrammarStackElement *this,TokenType *t,
          TokenStream<SGParser::Generator::StdGrammarToken> *stream)

{
  String *this_00;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_58 [8];
  TokenType tok;
  TokenStream<SGParser::Generator::StdGrammarToken> *stream_local;
  TokenType *t_local;
  StdGrammarStackElement *this_local;
  
  tok.Offset = (size_t)stream;
  StdGrammarToken::StdGrammarToken((StdGrammarToken *)local_58);
  (**(code **)(*(long *)tok.Offset + 0x10))(tok.Offset,(StdGrammarToken *)local_58);
  if ((this->field_1).pData == (void *)0x0) {
    this_00 = (String *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)&tok);
    (this->field_1).pString = this_00;
    this->Type = 0x20000000;
    this->Line = tok.Str.field_2._8_8_;
    this->Offset = tok.Line;
    uVar1 = std::__cxx11::string::size();
    if (this->MaxErrorStrLength < uVar1) {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)this->field_1);
      std::operator+(&local_88,&local_a8,"...");
      std::__cxx11::string::operator=((string *)(this->field_1).pString,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    StdGrammarToken::~StdGrammarToken((StdGrammarToken *)local_58);
    return;
  }
  __assert_fail("pData == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                ,0x1f5,
                "void SGParser::Generator::StdGrammarStackElement::SetErrorData(TokenType &, TokenStream<TokenType> &)"
               );
}

Assistant:

void SetErrorData([[maybe_unused]] TokenType& t, TokenStream<TokenType>& stream) {
        TokenType tok;
        stream.GetNextToken(tok);
        // Get Error token String
        SG_ASSERT(pData == nullptr);
        pString = new String{tok.Str};
        Type    = DataString;
        Line    = tok.Line;
        Offset  = tok.Offset;

        // Shorten the error to MaxErrorStrLength characters and add three dots
        if (pString->size() > MaxErrorStrLength)
            *pString = pString->substr(0u, MaxErrorStrLength) + "...";
    }